

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray
          (DescriptorProto_ReservedRange *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  uint8 *puVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->start_;
    *target = '\b';
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target[1] = (byte)uVar2;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar5 = (ulong)(long)(int)uVar2 >> 7;
      if (uVar2 < 0x4000) {
        target[2] = (uint8)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar7 = target;
          puVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = puVar7 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar4);
        *puVar7 = (uint8)uVar6;
      }
    }
  }
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar1 = this->end_;
    *target = '\x10';
    if ((ulong)(long)(int)uVar1 < 0x80) {
      target[1] = (byte)uVar1;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar1 | 0x80;
      uVar5 = (ulong)(long)(int)uVar1 >> 7;
      if (uVar1 < 0x4000) {
        target[2] = (uint8)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar7 = target;
          puVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = puVar7 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar4);
        *puVar7 = (uint8)uVar6;
      }
    }
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return target;
  }
  puVar7 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
  return puVar7;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto.ReservedRange)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 start = 1;
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_start(), target);
  }

  // optional int32 end = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto.ReservedRange)
  return target;
}